

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::makeDeltaTicks(MidiFile *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  reference ppMVar7;
  MidiEvent *pMVar8;
  ostream *poVar9;
  void *this_00;
  int deltatick;
  int *timedata;
  int length;
  int temp;
  int j;
  int i;
  MidiFile *this_local;
  
  iVar2 = getTickState(this);
  if (iVar2 != 0) {
    iVar2 = getNumTracks(this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2;
    uVar5 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar5);
    for (temp = 0; temp < iVar2; temp = temp + 1) {
      *(undefined4 *)((long)pvVar6 + (long)temp * 4) = 0;
      ppMVar7 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)temp);
      iVar3 = MidiEventList::size(*ppMVar7);
      if (0 < iVar3) {
        ppMVar7 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                  operator[](&this->m_events,(long)temp);
        pMVar8 = MidiEventList::operator[](*ppMVar7,0);
        *(int *)((long)pvVar6 + (long)temp * 4) = pMVar8->tick;
        length = 1;
        while( true ) {
          ppMVar7 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)temp);
          iVar3 = MidiEventList::size(*ppMVar7);
          if (iVar3 <= length) break;
          ppMVar7 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)temp);
          pMVar8 = MidiEventList::operator[](*ppMVar7,length);
          iVar3 = pMVar8->tick;
          iVar4 = iVar3 - *(int *)((long)pvVar6 + (long)temp * 4);
          if (iVar4 < 0) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"Error: negative delta tick value: ");
            this_00 = (void *)std::ostream::operator<<(poVar9,iVar4);
            poVar9 = (ostream *)
                     std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            poVar9 = std::operator<<(poVar9,"Timestamps must be sorted first");
            poVar9 = std::operator<<(poVar9," (use MidiFile::sortTracks() before writing).");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
          ppMVar7 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                    operator[](&this->m_events,(long)temp);
          pMVar8 = MidiEventList::operator[](*ppMVar7,length);
          pMVar8->tick = iVar4;
          *(int *)((long)pvVar6 + (long)temp * 4) = iVar3;
          length = length + 1;
        }
      }
    }
    this->m_theTimeState = 0;
    if (pvVar6 != (void *)0x0) {
      operator_delete__(pvVar6);
    }
  }
  return;
}

Assistant:

void MidiFile::makeDeltaTicks(void) {
	if (getTickState() == TIME_STATE_DELTA) {
		return;
	}
	int i, j;
	int temp;
	int length = getNumTracks();
	int *timedata = new int[length];
	for (i=0; i<length; i++) {
		timedata[i] = 0;
		if (m_events[i]->size() > 0) {
			timedata[i] = (*m_events[i])[0].tick;
		} else {
			continue;
		}
		for (j=1; j<(int)m_events[i]->size(); j++) {
			temp = (*m_events[i])[j].tick;
			int deltatick = temp - timedata[i];
			if (deltatick < 0) {
				std::cerr << "Error: negative delta tick value: " << deltatick << std::endl
				     << "Timestamps must be sorted first"
				     << " (use MidiFile::sortTracks() before writing)." << std::endl;
			}
			(*m_events[i])[j].tick = deltatick;
			timedata[i] = temp;
		}
	}
	m_theTimeState = TIME_STATE_DELTA;
	delete [] timedata;
}